

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * mergematches(match a,matches *b)

{
  ulong *puVar1;
  int iVar2;
  easm_expr *peVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  matches *pmVar8;
  long lVar9;
  reloc *prVar10;
  match *pmVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined8 uStack_f8;
  matches *local_f0;
  match nm;
  
  pmVar8 = emptymatches();
  iVar7 = a.nrelocs;
  uStack_f8._4_4_ = a.oplen;
  lVar17 = 0;
  uVar16 = 0;
  if (0 < a.nrelocs) {
    uVar16 = (ulong)(uint)a.nrelocs;
  }
  lVar15 = 0x18;
  local_f0 = b;
  do {
    lVar9 = -0x10;
    pmVar11 = b->m;
    if (b->mnum <= lVar17) {
      free(pmVar11);
      free(b);
      return pmVar8;
    }
    while (lVar9 != 0) {
      lVar4 = lVar9 + lVar15;
      lVar5 = lVar9 + lVar15;
      lVar6 = lVar9 + -8;
      puVar1 = (ulong *)((long)a.m + lVar9);
      lVar9 = lVar9 + 8;
      if ((*(ulong *)((long)pmVar11->a + lVar5 + 8) & *(ulong *)((long)a.relocs + lVar6) &
          (*(ulong *)((long)pmVar11->a + lVar4 + -8) ^ *puVar1)) != 0) goto LAB_00246bd6;
    }
    memcpy(&nm,pmVar11 + lVar17,0xb8);
    if (nm.oplen == 0) {
      nm.oplen = uStack_f8._4_4_;
    }
    for (lVar9 = 3; lVar9 != 5; lVar9 = lVar9 + 1) {
      (&uStack_f8)[lVar9] = (&uStack_f8)[lVar9] | *(ulong *)(&stack0xfffffffffffffff8 + lVar9 * 8);
      nm.a[lVar9 + -1] = nm.a[lVar9 + -1] | a.a[lVar9 + -1];
    }
    if (8 < nm.nrelocs + iVar7) {
      __assert_fail("a.nrelocs + nm.nrelocs <= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/envytools[P]envytools/envydis/core-as.c"
                    ,0x4c,"struct matches *mergematches(struct match, struct matches *)");
    }
    prVar10 = a.relocs;
    for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
      iVar13 = nm.nrelocs + (int)uVar12;
      peVar3 = prVar10->expr;
      nm.relocs[iVar13].bf = prVar10->bf;
      nm.relocs[iVar13].expr = peVar3;
      prVar10 = prVar10 + 1;
    }
    nm.nrelocs = nm.nrelocs + iVar7;
    iVar13 = pmVar8->mnum;
    iVar2 = pmVar8->mmax;
    pmVar11 = pmVar8->m;
    if (iVar2 <= iVar13) {
      iVar14 = iVar2 * 2;
      if (iVar2 == 0) {
        iVar14 = 0x10;
      }
      pmVar8->mmax = iVar14;
      pmVar11 = (match *)realloc(pmVar11,(long)iVar14 * 0xb8);
      pmVar8->m = pmVar11;
    }
    pmVar8->mnum = iVar13 + 1;
    memcpy(pmVar11 + iVar13,&nm,0xb8);
    b = local_f0;
LAB_00246bd6:
    lVar17 = lVar17 + 1;
    lVar15 = lVar15 + 0xb8;
  } while( true );
}

Assistant:

struct matches *mergematches(struct match a, struct matches *b) {
	struct matches *res = emptymatches();
	int i, j;
	for (i = 0; i < b->mnum; i++) {
		for (j = 0; j < MAXOPLEN; j++) {
			ull cmask = a.m[j] & b->m[i].m[j];
			if ((a.a[j] & cmask) != (b->m[i].a[j] & cmask))
				break;
		}
		if (j == MAXOPLEN) {
			struct match nm = b->m[i];
			if (!nm.oplen)
				nm.oplen = a.oplen;
			for (j = 0; j < MAXOPLEN; j++) {
				nm.a[j] |= a.a[j];
				nm.m[j] |= a.m[j];
			}
			int j;
			assert (a.nrelocs + nm.nrelocs <= 8);
			for (j = 0; j < a.nrelocs; j++)
				nm.relocs[nm.nrelocs + j] = a.relocs[j];
			nm.nrelocs += a.nrelocs;
			ADDARRAY(res->m, nm);
		}
	}
	free(b->m);
	free(b);
	return res;
}